

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O1

void __thiscall duckdb::DeleteLocalState::~DeleteLocalState(DeleteLocalState *this)

{
  _Head_base<0UL,_duckdb::TableDeleteState_*,_false> __ptr;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__DeleteLocalState_024a0980;
  __ptr._M_head_impl =
       (this->delete_state).
       super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
       .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (TableDeleteState *)0x0) {
    ::std::default_delete<duckdb::TableDeleteState>::operator()
              ((default_delete<duckdb::TableDeleteState> *)&this->delete_state,__ptr._M_head_impl);
  }
  (this->delete_state).
  super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
  .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl = (TableDeleteState *)0x0;
  DataChunk::~DataChunk(&this->delete_chunk);
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_0248f280;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

DeleteLocalState(ClientContext &context, TableCatalogEntry &table,
	                 const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
		const auto &types = table.GetTypes();
		auto initialize = vector<bool>(types.size(), false);
		delete_chunk.Initialize(Allocator::Get(context), types, initialize);

		auto &storage = table.GetStorage();
		delete_state = storage.InitializeDelete(table, context, bound_constraints);
	}